

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O2

int AF_A_LeafSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  PClassActor *type;
  AActor *this_00;
  AActor *this_01;
  int iVar7;
  char *pcVar8;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_0053e172;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_01 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_01 == (AActor *)0x0) {
LAB_0053dfc2:
        this_01 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_01,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053e172;
        }
      }
      if (numparam == 1) goto LAB_0053e042;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053e162;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              pcVar8 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053e172;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053e162;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053e042:
        uVar3 = FRandom::operator()(&pr_leaf);
        iVar7 = (uVar3 & 3) + 1;
        while (bVar2 = iVar7 != 0, iVar7 = iVar7 + -1, bVar2) {
          iVar4 = FRandom::Random2(&pr_leaf);
          iVar5 = FRandom::Random2(&pr_leaf);
          iVar6 = FRandom::operator()(&pr_leaf);
          uVar3 = FRandom::operator()(&pr_leaf);
          pcVar8 = "Leaf1";
          if ((uVar3 & 1) == 0) {
            pcVar8 = "Leaf2";
          }
          type = PClass::FindActor(pcVar8);
          AActor::Vec3Offset(&local_48,this_01,(double)iVar4 * 0.25,(double)iVar5 * 0.25,
                             (double)iVar6 * 0.25,false);
          this_00 = Spawn(type,&local_48,ALLOW_REPLACE);
          if (this_00 != (AActor *)0x0) {
            iVar4 = FRandom::operator()(&pr_leaf);
            AActor::Thrust(this_00,(double)iVar4 * 0.0078125 + 3.0);
            (this_00->target).field_0.p = this_01;
            this_00->special1 = 0;
          }
        }
        return 0;
      }
      pcVar8 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053e172;
    }
    if (this_01 == (AActor *)0x0) goto LAB_0053dfc2;
  }
LAB_0053e162:
  pcVar8 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053e172:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0xd2,"int AF_A_LeafSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LeafSpawn)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = (pr_leaf()&3)+1; i; i--)
	{
		double xo = pr_leaf.Random2() / 4.;
		double yo = pr_leaf.Random2() / 4.;
		double zo = pr_leaf() / 4.;
		mo = Spawn (pr_leaf()&1 ? PClass::FindActor ("Leaf1") : PClass::FindActor ("Leaf2"),
			self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);

		if (mo)
		{
			mo->Thrust(pr_leaf() / 128. + 3);
			mo->target = self;
			mo->special1 = 0;
		}
	}
	return 0;
}